

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall gvr::Mesh::savePLY(Mesh *this,char *name,bool all,ply_encoding enc)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int in_ECX;
  size_t sVar7;
  byte in_DL;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  char *in_RSI;
  string *psVar8;
  Mesh *in_RDI;
  int i_1;
  int i;
  PLYWriter ply;
  uint in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  string *in_stack_fffffffffffffa88;
  allocator *paVar9;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined8 in_stack_fffffffffffffb00;
  ply_type tvalue;
  allocator *paVar10;
  allocator *name_00;
  undefined4 in_stack_fffffffffffffb10;
  int local_4cc;
  uint local_4c8;
  allocator local_4c1;
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [120];
  PLYWriter *in_stack_fffffffffffffde8;
  Model *in_stack_fffffffffffffdf0;
  
  tvalue = (ply_type)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  bVar1 = in_DL & 1;
  PLYWriter::PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  PLYWriter::open((PLYWriter *)(local_290 + 0x30),in_RSI,in_ECX);
  Model::setOriginToPLY(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"vertex",&local_291);
  iVar3 = PointCloud::getVertexCount(&in_RDI->super_PointCloud);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80)
            );
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  name_00 = &local_2b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"x",name_00);
  PLYWriter::addProperty
            ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,tvalue);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  paVar10 = &local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"y",paVar10);
  PLYWriter::addProperty
            ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
             (ply_type)((ulong)paVar10 >> 0x20));
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"z",&local_309);
  PLYWriter::addProperty
            ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
             (ply_type)((ulong)paVar10 >> 0x20));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"scan_size",&local_331);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    if (bVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"scan_error",&local_359);
      PLYWriter::addProperty
                ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
                 (ply_type)((ulong)paVar10 >> 0x20));
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"scan_conf",&local_381);
      PLYWriter::addProperty
                ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
                 (ply_type)((ulong)paVar10 >> 0x20));
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
    }
  }
  if ((bVar1 != 0) && (bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"sx",&local_3a9);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"sy",&local_3d1);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"sz",&local_3f9);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  if (bVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"nx",&local_421);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_448,"ny",&local_449);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"nz",&local_471);
    PLYWriter::addProperty
              ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
               (ply_type)((ulong)paVar10 >> 0x20));
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"face",&local_499);
  iVar4 = getTriangleCount(in_RDI);
  PLYWriter::addElement
            ((PLYWriter *)CONCAT44(iVar4,in_stack_fffffffffffffa90),in_stack_fffffffffffffa88,
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  paVar9 = &local_4c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"vertex_indices",paVar9);
  psVar8 = local_4c0;
  PLYWriter::addProperty
            ((PLYWriter *)CONCAT44(iVar3,in_stack_fffffffffffffb10),(string *)name_00,
             (ply_type)((ulong)paVar10 >> 0x20),(ply_type)paVar10);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  local_4c8 = 0;
  while( true ) {
    uVar6 = local_4c8;
    uVar5 = PointCloud::getVertexCount(&in_RDI->super_PointCloud);
    sVar7 = (size_t)uVar5;
    if ((int)uVar5 <= (int)uVar6) break;
    uVar6 = local_4c8;
    PointCloud::getVertexComp(&in_RDI->super_PointCloud,local_4c8,0);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf,sVar7);
    uVar6 = local_4c8;
    PointCloud::getVertexComp(&in_RDI->super_PointCloud,local_4c8,1);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_00,sVar7);
    psVar8 = (string *)(ulong)local_4c8;
    PointCloud::getVertexComp(&in_RDI->super_PointCloud,local_4c8,2);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar8,__buf_01,sVar7);
    bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
    if (bVar2) {
      psVar8 = (string *)(ulong)local_4c8;
      PointCloud::getScanSize(&in_RDI->super_PointCloud,local_4c8);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar8,__buf_02,sVar7);
      if (bVar1 != 0) {
        uVar6 = local_4c8;
        PointCloud::getScanError(&in_RDI->super_PointCloud,local_4c8);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_03,sVar7);
        psVar8 = (string *)(ulong)local_4c8;
        PointCloud::getScanConf(&in_RDI->super_PointCloud,local_4c8);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar8,__buf_04,sVar7);
      }
    }
    if ((bVar1 != 0) && (bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud), bVar2)) {
      uVar6 = local_4c8;
      PointCloud::getScanPosComp(&in_RDI->super_PointCloud,local_4c8,0);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_05,sVar7);
      uVar6 = local_4c8;
      PointCloud::getScanPosComp(&in_RDI->super_PointCloud,local_4c8,1);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_06,sVar7);
      psVar8 = (string *)(ulong)local_4c8;
      PointCloud::getScanPosComp(&in_RDI->super_PointCloud,local_4c8,2);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar8,__buf_07,sVar7);
    }
    if (bVar1 != 0) {
      uVar6 = local_4c8;
      getNormalComp(in_RDI,local_4c8,0);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_08,sVar7);
      uVar6 = local_4c8;
      getNormalComp(in_RDI,local_4c8,1);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_09,sVar7);
      psVar8 = (string *)(ulong)local_4c8;
      getNormalComp(in_RDI,local_4c8,2);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),(int)psVar8,__buf_10,sVar7);
    }
    local_4c8 = local_4c8 + 1;
  }
  local_4cc = 0;
  while( true ) {
    iVar4 = (int)psVar8;
    iVar3 = local_4cc;
    uVar6 = getTriangleCount(in_RDI);
    sVar7 = (size_t)uVar6;
    if ((int)uVar6 <= iVar3) break;
    PLYWriter::writeListSize((PLYWriter *)CONCAT44(uVar6,iVar3),in_stack_fffffffffffffa3c);
    in_stack_fffffffffffffa3c = getTriangleIndex(in_RDI,local_4cc,0);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),in_stack_fffffffffffffa3c,__buf_11,sVar7);
    uVar6 = getTriangleIndex(in_RDI,local_4cc,1);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_12,sVar7);
    uVar6 = getTriangleIndex(in_RDI,local_4cc,2);
    psVar8 = (string *)(ulong)uVar6;
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),uVar6,__buf_13,sVar7);
    local_4cc = local_4cc + 1;
  }
  PLYWriter::close((PLYWriter *)(local_290 + 0x30),iVar4);
  PLYWriter::~PLYWriter((PLYWriter *)CONCAT44(uVar6,iVar3));
  return;
}

Assistant:

void Mesh::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define header

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}